

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::detail::
make_any_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
          (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,detail *this,syntax_option_type flags,
          regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  undefined2 uVar1;
  undefined4 uVar2;
  uint7 uVar3;
  char_type cVar4;
  undefined4 in_EAX;
  undefined4 in_register_00000014;
  set_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::int_<2>_>
  *matcher;
  detail *this_00;
  uint uVar5;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = in_EAX;
  cVar4 = cpp_regex_traits<char>::widen
                    ((cpp_regex_traits<char> *)CONCAT44(in_register_00000014,flags),'\n');
  uVar2 = (undefined4)uStack_18;
  uVar1 = (undefined2)(undefined4)uStack_18;
  uStack_18._0_7_ = CONCAT25(0x100,CONCAT14(cVar4,(undefined4)uStack_18));
  uVar3 = (uint7)uStack_18;
  uStack_18 = (ulong)(uint7)uStack_18;
  uVar5 = (uint)((ulong)this >> 0xb) & 3;
  matcher = (set_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::int_<2>_>
             *)((long)&switchD_001221b0::switchdataD_001551b8 +
               (long)(int)(&switchD_001221b0::switchdataD_001551b8)[uVar5]);
  switch(uVar5) {
  case 0:
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::any_matcher>
              (__return_storage_ptr__,(detail *)((long)&uStack_18 + 1),(any_matcher *)matcher);
    return __return_storage_ptr__;
  case 1:
    this_00 = (detail *)((long)&uStack_18 + 3);
    uStack_18 = (ulong)CONCAT34((int3)(uVar3 >> 0x20),uVar2) & 0xffffffff00ffffff;
    break;
  case 2:
    this_00 = (detail *)((long)&uStack_18 + 2);
    uStack_18 = (ulong)CONCAT43((int)(uVar3 >> 0x18),CONCAT12(cVar4,uVar1));
    break;
  case 3:
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::set_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::int_<2>>>
              (__return_storage_ptr__,(detail *)((long)&uStack_18 + 4),matcher);
    return __return_storage_ptr__;
  }
  make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<true>>>
            (__return_storage_ptr__,this_00,
             (literal_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_mpl_::bool_<true>_>
              *)matcher);
  return __return_storage_ptr__;
}

Assistant:

inline sequence<BidiIter> make_any_xpression
(
    regex_constants::syntax_option_type flags
  , Traits const &tr
)
{
    using namespace regex_constants;
    typedef typename iterator_value<BidiIter>::type char_type;
    typedef detail::set_matcher<Traits, mpl::int_<2> > set_matcher;
    typedef literal_matcher<Traits, mpl::false_, mpl::true_> literal_matcher;

    char_type const newline = tr.widen('\n');
    set_matcher s;
    s.set_[0] = newline;
    s.set_[1] = 0;
    s.inverse();

    switch(((int)not_dot_newline | not_dot_null) & flags)
    {
    case not_dot_null:
        return make_dynamic<BidiIter>(literal_matcher(char_type(0), tr));

    case not_dot_newline:
        return make_dynamic<BidiIter>(literal_matcher(newline, tr));

    case (int)not_dot_newline | not_dot_null:
        return make_dynamic<BidiIter>(s);

    default:
        return make_dynamic<BidiIter>(any_matcher());
    }
}